

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O1

void __thiscall HEkkDualRHS::chooseNormal(HEkkDualRHS *this,HighsInt *chIndex)

{
  double dVar1;
  double dVar2;
  uint32_t uVar3;
  int iVar4;
  HEkk *pHVar5;
  uint uVar6;
  bool bVar7;
  uint32_t uVar8;
  undefined8 in_RAX;
  ulong uVar9;
  ulong uVar10;
  uint32_t uVar11;
  int iVar12;
  long lVar13;
  uint32_t uVar14;
  int iVar15;
  bool bVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  undefined8 uStack_38;
  
  if (this->workCount == 0) {
    *chIndex = -1;
    return;
  }
  uStack_38 = in_RAX;
  bVar7 = HighsSimplexAnalysis::simplexTimerRunning(this->analysis,0x26,0);
  if (!bVar7) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x26,0);
  }
  pHVar5 = this->ekk_instance_;
  uVar3 = this->workCount;
  if ((int)uVar3 < 0) {
    uVar8 = 0;
    if (uVar3 != 0xffffffff) {
      uVar6 = 0x1f;
      if (~uVar3 != 0) {
        for (; ~uVar3 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar8 = HighsRandom::drawUniform(&pHVar5->random_,-uVar3,(uVar6 ^ 0xffffffe0) + 0x21);
    }
    uVar9 = 0xffffffff;
    dVar18 = 0.0;
    iVar15 = 0;
    do {
      uVar11 = uVar8;
      uVar14 = 0;
      if (iVar15 == 0) {
        uVar11 = -uVar3;
        uVar14 = uVar8;
      }
      if ((int)uVar14 < (int)uVar11) {
        uVar10 = (ulong)(int)uVar14;
        do {
          dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar10];
          if (1e-50 < dVar1) {
            dVar2 = (pHVar5->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10];
            dVar19 = dVar18 * dVar2;
            if (dVar19 < dVar1) {
              uVar9 = uVar10 & 0xffffffff;
            }
            uVar17 = -(ulong)(dVar19 < dVar1);
            dVar18 = (double)(~uVar17 & (ulong)dVar18 | (ulong)(dVar1 / dVar2) & uVar17);
          }
          uVar10 = uVar10 + 1;
        } while ((long)(int)uVar11 != uVar10);
      }
      bVar16 = iVar15 == 0;
      iVar15 = iVar15 + 1;
    } while (bVar16);
    *chIndex = (HighsInt)uVar9;
    goto LAB_0035965e;
  }
  uVar8 = 0;
  if (1 < (int)uVar3) {
    uVar6 = 0x1f;
    if (uVar3 - 1 != 0) {
      for (; uVar3 - 1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar8 = HighsRandom::drawUniform(&pHVar5->random_,uVar3,(uVar6 ^ 0xffffffe0) + 0x21);
  }
  iVar12 = -1;
  dVar18 = 0.0;
  iVar15 = 0;
  do {
    uVar14 = uVar8;
    uVar3 = 0;
    if (iVar15 == 0) {
      uVar14 = this->workCount;
      uVar3 = uVar8;
    }
    if ((int)uVar3 < (int)uVar14) {
      lVar13 = (long)(int)uVar3;
      do {
        iVar4 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13];
        dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar4];
        if ((1e-50 < dVar1) &&
           (dVar2 = (this->ekk_instance_->dual_edge_weight_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar4], dVar18 * dVar2 < dVar1)) {
          dVar18 = dVar1 / dVar2;
          iVar12 = iVar4;
        }
        lVar13 = lVar13 + 1;
      } while ((int)uVar14 != lVar13);
    }
    bVar16 = iVar15 == 0;
    iVar15 = iVar15 + 1;
  } while (bVar16);
  uStack_38 = CONCAT44(iVar12,(int)uStack_38);
  if (iVar12 == -1) {
    if (0.0 < this->workCutoff) goto LAB_00359579;
  }
  else if (dVar18 <= this->workCutoff * 0.99) {
LAB_00359579:
    createInfeasList(this,0.0);
    chooseNormal(this,(HighsInt *)((long)&uStack_38 + 4));
  }
  *chIndex = uStack_38._4_4_;
LAB_0035965e:
  if (bVar7) {
    return;
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
  return;
}

Assistant:

void HEkkDualRHS::chooseNormal(HighsInt* chIndex) {
  // Moved the following to the top to avoid starting the clock for a trivial
  // call. NB Must still call HighsInt to maintain sequence of random numbers
  // for code reproducibility!! Never mind if we're not timing the random number
  // call!!
  // HighsInt random = ekk_instance_.random_.integer();
  if (workCount == 0) {
    *chIndex = -1;
    return;
  }

  // Since chooseNormal calls itself, only start the clock if it's not
  // currently running
  bool keep_timer_running = analysis->simplexTimerRunning(ChuzrDualClock);
  //      timer.clock_start[info.clock_[ChuzrDualClock]] < 0;
  if (!keep_timer_running) {
    analysis->simplexTimerStart(ChuzrDualClock);
  }

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    double bestMerit = 0;
    HighsInt bestIndex = -1;
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          //	  printf("Dense: Row %4" HIGHSINT_FORMAT " weight = %g\n", iRow,
          // myWeight);
          if (bestMerit * myWeight < myInfeas) {
            bestMerit = myInfeas / myWeight;
            bestIndex = iRow;
          }
        }
      }
    }
    *chIndex = bestIndex;
  } else {
    // SPARSE mode
    HighsInt randomStart = ekk_instance_.random_.integer(workCount);
    double bestMerit = 0;
    HighsInt bestIndex = -1;
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          /*
          const double myMerit = myInfeas / myWeight;
          printf("CHUZR: iRow = %6" HIGHSINT_FORMAT "; Infeas = %11.4g; Weight =
          %11.4g; Merit = %11.4g\n", iRow, myInfeas, myWeight, myMerit);
          */
          if (bestMerit * myWeight < myInfeas) {
            bestMerit = myInfeas / myWeight;
            bestIndex = iRow;
          }
        }
      }
    }

    HighsInt createListAgain = 0;
    if (bestIndex == -1) {
      createListAgain = workCutoff > 0;
    } else if (bestMerit <= workCutoff * 0.99) {
      createListAgain = 1;
    }
    if (createListAgain) {
      createInfeasList(0);
      chooseNormal(&bestIndex);
    }
    *chIndex = bestIndex;
  }
  // Since chooseNormal calls itself, only stop the clock if it's not currently
  // running
  if (!keep_timer_running) analysis->simplexTimerStop(ChuzrDualClock);
}